

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O2

UBool __thiscall
icu_63::RuleBasedTimeZone::findNext
          (RuleBasedTimeZone *this,UDate base,UBool inclusive,UDate *transitionTime,
          TimeZoneRule **fromRule,TimeZoneRule **toRule)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  TimeZoneRule *this_00;
  TimeZoneRule *this_01;
  int iVar10;
  TimeZoneRule *this_02;
  double local_70;
  UDate start1;
  UDate start0;
  
  if (this->fHistoricTransitions == (UVector *)0x0) goto LAB_001f57cb;
  pdVar8 = (double *)UVector::elementAt(this->fHistoricTransitions,0);
  local_70 = *pdVar8;
  if (base < local_70) {
LAB_001f55fa:
    this_01 = (TimeZoneRule *)pdVar8[1];
    this_02 = (TimeZoneRule *)pdVar8[2];
LAB_001f5608:
    bVar1 = true;
LAB_001f560b:
    iVar3 = TimeZoneRule::getRawOffset(this_01);
    iVar4 = TimeZoneRule::getRawOffset(this_02);
    if (iVar3 == iVar4) {
      iVar3 = TimeZoneRule::getDSTSavings(this_01);
      iVar4 = TimeZoneRule::getDSTSavings(this_02);
      if (iVar3 == iVar4) {
        if (bVar1) {
          UVar2 = findNext(this,local_70,'\0',transitionTime,fromRule,toRule);
          return UVar2;
        }
        goto LAB_001f57cb;
      }
    }
    *transitionTime = local_70;
    *fromRule = this_01;
    *toRule = this_02;
    UVar2 = '\x01';
  }
  else {
    if (inclusive != '\0') {
      if ((local_70 == base) && (!NAN(local_70) && !NAN(base))) goto LAB_001f55fa;
    }
    iVar10 = this->fHistoricTransitions->count;
    pdVar8 = (double *)UVector::elementAt(this->fHistoricTransitions,iVar10 + -1);
    local_70 = *pdVar8;
    if (inclusive != '\0') {
      if ((local_70 == base) && (!NAN(local_70) && !NAN(base))) goto LAB_001f55fa;
    }
    if (base < local_70) {
      iVar10 = iVar10 + -2;
      while (pdVar9 = pdVar8, 0 < iVar10) {
        pdVar8 = (double *)UVector::elementAt(this->fHistoricTransitions,iVar10);
        if ((*pdVar8 < base) || (iVar10 = iVar10 + -1, inclusive == '\0' && base == *pdVar8)) break;
      }
      local_70 = *pdVar9;
      this_01 = (TimeZoneRule *)pdVar9[1];
      this_02 = (TimeZoneRule *)pdVar9[2];
      goto LAB_001f5608;
    }
    if (this->fFinalRules != (UVector *)0x0) {
      this_00 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,0);
      this_01 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,1);
      uVar5 = TimeZoneRule::getRawOffset(this_01);
      uVar6 = TimeZoneRule::getDSTSavings(this_01);
      iVar10 = (*(this_00->super_UObject)._vptr_UObject[9])
                         (base,this_00,(ulong)uVar5,(ulong)uVar6,(ulong)(uint)(int)inclusive,&start0
                         );
      uVar5 = TimeZoneRule::getRawOffset(this_00);
      uVar6 = TimeZoneRule::getDSTSavings(this_00);
      iVar7 = (*(this_01->super_UObject)._vptr_UObject[9])
                        (base,this_01,(ulong)uVar5,(ulong)uVar6,(ulong)(uint)(int)inclusive,&start1)
      ;
      if ((char)iVar10 == '\0' && (char)iVar7 == '\0') goto LAB_001f57cb;
      this_02 = this_00;
      local_70 = start0;
      if (start1 <= start0 && (char)iVar7 != '\0') {
        this_02 = this_01;
        this_01 = this_00;
        local_70 = start1;
      }
      bVar1 = false;
      goto LAB_001f560b;
    }
LAB_001f57cb:
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UBool
RuleBasedTimeZone::findNext(UDate base, UBool inclusive, UDate& transitionTime,
                            TimeZoneRule*& fromRule, TimeZoneRule*& toRule) const {
    if (fHistoricTransitions == NULL) {
        return FALSE;
    }
    UBool isFinal = FALSE;
    UBool found = FALSE;
    Transition result;
    Transition *tzt = (Transition*)fHistoricTransitions->elementAt(0);
    UDate tt = tzt->time;
    if (tt > base || (inclusive && tt == base)) {
        result = *tzt;
        found = TRUE;
    } else {
        int32_t idx = fHistoricTransitions->size() - 1;        
        tzt = (Transition*)fHistoricTransitions->elementAt(idx);
        tt = tzt->time;
        if (inclusive && tt == base) {
            result = *tzt;
            found = TRUE;
        } else if (tt <= base) {
            if (fFinalRules != NULL) {
                // Find a transion time with finalRules
                TimeZoneRule *r0 = (TimeZoneRule*)fFinalRules->elementAt(0);
                TimeZoneRule *r1 = (TimeZoneRule*)fFinalRules->elementAt(1);
                UDate start0, start1;
                UBool avail0 = r0->getNextStart(base, r1->getRawOffset(), r1->getDSTSavings(), inclusive, start0);
                UBool avail1 = r1->getNextStart(base, r0->getRawOffset(), r0->getDSTSavings(), inclusive, start1);
                //  avail0/avail1 should be always TRUE
                if (!avail0 && !avail1) {
                    return FALSE;
                }
                if (!avail1 || start0 < start1) {
                    result.time = start0;
                    result.from = r1;
                    result.to = r0;
                } else {
                    result.time = start1;
                    result.from = r0;
                    result.to = r1;
                }
                isFinal = TRUE;
                found = TRUE;
            }
        } else {
            // Find a transition within the historic transitions
            idx--;
            Transition *prev = tzt;
            while (idx > 0) {
                tzt = (Transition*)fHistoricTransitions->elementAt(idx);
                tt = tzt->time;
                if (tt < base || (!inclusive && tt == base)) {
                    break;
                }
                idx--;
                prev = tzt;
            }
            result.time = prev->time;
            result.from = prev->from;
            result.to = prev->to;
            found = TRUE;
        }
    }
    if (found) {
        // For now, this implementation ignore transitions with only zone name changes.
        if (result.from->getRawOffset() == result.to->getRawOffset()
            && result.from->getDSTSavings() == result.to->getDSTSavings()) {
            if (isFinal) {
                return FALSE;
            } else {
                // No offset changes.  Try next one if not final
                return findNext(result.time, FALSE /* always exclusive */,
                    transitionTime, fromRule, toRule);
            }
        }
        transitionTime = result.time;
        fromRule = result.from;
        toRule = result.to;
        return TRUE;
    }
    return FALSE;
}